

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

bool __thiscall ADSBExchangeConnection::InitCurl(ADSBExchangeConnection *this)

{
  bool bVar1;
  logLevelTy lVar2;
  string *psVar3;
  ulong uVar4;
  curl_slist *pcVar5;
  LTError *this_00;
  string *in_RDI;
  string theKey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  LTOnlineChannel *in_stack_ffffffffffffff88;
  string local_60 [32];
  undefined4 local_40;
  string local_30 [32];
  string *theKey_00;
  bool local_1;
  
  theKey_00 = in_RDI;
  psVar3 = DataRefs::GetADSBExAPIKey_abi_cxx11_(&dataRefs);
  std::__cxx11::string::string(local_30,(string *)psVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = LTOnlineChannel::InitCurl(in_stack_ffffffffffffff88);
    if (bVar1) {
      curl_easy_setopt(*(undefined8 *)((long)&in_RDI[4].field_2 + 8),0x4e6f,ReceiveHeader);
      if ((in_RDI[0x11]._M_string_length == 0) ||
         (bVar1 = std::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1)) {
        std::__cxx11::string::operator=((string *)&in_RDI[0x10]._M_string_length,local_30);
        if (in_RDI[0x11]._M_string_length != 0) {
          curl_slist_free_all(in_RDI[0x11]._M_string_length);
          in_RDI[0x11]._M_string_length = 0;
        }
        std::__cxx11::string::string(local_60,(string *)&in_RDI[0x10]._M_string_length);
        pcVar5 = MakeCurlSList(theKey_00);
        in_RDI[0x11]._M_string_length = (size_type)pcVar5;
        std::__cxx11::string::~string(local_60);
      }
      if (in_RDI[0x11]._M_string_length == 0) {
        this_00 = (LTError *)__cxa_allocate_exception(0x18);
        LTError::LTError(this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                         ,0x1c2,"InitCurl",logFATAL,"ASSERT FAILED: %s","slistKey");
        __cxa_throw(this_00,&LTError::typeinfo,LTError::~LTError);
      }
      curl_easy_setopt(*(undefined8 *)((long)&in_RDI[4].field_2 + 8),0x2727,
                       in_RDI[0x11]._M_string_length);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    std::__cxx11::string::clear();
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x1ab,"InitCurl",logERR,
             "ADS-B Exchange: API Key missing. Get one at rapidapi.com/adsbx/api/adsbexchange-com1 and enter it in Basic Settings."
            );
    }
    CreateMsgWindow(12.0,logERR,
                    "ADS-B Exchange: API Key missing. Get one at rapidapi.com/adsbx/api/adsbexchange-com1 and enter it in Basic Settings."
                   );
    (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,0,1);
    local_1 = false;
  }
  local_40 = 1;
  std::__cxx11::string::~string(local_30);
  return local_1;
}

Assistant:

bool ADSBExchangeConnection::InitCurl ()
{
    // we require an API key
    const std::string theKey (dataRefs.GetADSBExAPIKey());
    if (theKey.empty()) {
        apiKey.clear();
        SHOW_MSG(logERR, ERR_ADSBEX_NO_KEY_DEF);
        SetValid(false);
        return false;
    }
    
    // let's do the standard CURL init first
    if (!LTOnlineChannel::InitCurl())
        return false;

    // read headers
    curl_easy_setopt(pCurl, CURLOPT_HEADERFUNCTION, ReceiveHeader);

    // did the API key change?
    if (!slistKey || theKey != apiKey) {
        apiKey = theKey;
        if (slistKey) {
            curl_slist_free_all(slistKey);
            slistKey = NULL;
        }
        slistKey = MakeCurlSList(apiKey);
    }
    
    // now add/overwrite the key
    LOG_ASSERT(slistKey);
    curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, slistKey);
    return true;
}